

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O1

void av1_cnn_activate_c(float **output,int channels,int width,int height,int stride,
                       ACTIVATION layer_activation)

{
  float fVar1;
  float *pfVar2;
  ulong uVar3;
  int iVar4;
  undefined7 in_register_00000089;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  float fVar8;
  
  iVar4 = (int)CONCAT71(in_register_00000089,layer_activation);
  if (iVar4 == 1) {
    if (0 < channels) {
      uVar5 = 0;
      do {
        if (0 < height) {
          lVar6 = 0;
          uVar3 = 0;
          do {
            if (0 < width) {
              pfVar2 = output[uVar5];
              uVar7 = 0;
              do {
                fVar1 = *(float *)((long)pfVar2 + uVar7 * 4 + lVar6);
                fVar8 = 0.0;
                if (0.0 <= fVar1) {
                  fVar8 = fVar1;
                }
                *(float *)((long)pfVar2 + uVar7 * 4 + lVar6) = fVar8;
                uVar7 = uVar7 + 1;
              } while ((uint)width != uVar7);
            }
            uVar3 = uVar3 + 1;
            lVar6 = lVar6 + (long)stride * 4;
          } while (uVar3 != (uint)height);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != (uint)channels);
    }
  }
  else if ((iVar4 == 2) && (0 < channels)) {
    uVar5 = 0;
    do {
      if (0 < height) {
        lVar6 = 0;
        uVar3 = 0;
        do {
          if (0 < width) {
            pfVar2 = output[uVar5];
            uVar7 = 0;
            do {
              fVar1 = *(float *)((long)pfVar2 + uVar7 * 4 + lVar6);
              *(float *)((long)pfVar2 + uVar7 * 4 + lVar6) = fVar1 / (ABS(fVar1) + 1.0);
              uVar7 = uVar7 + 1;
            } while ((uint)width != uVar7);
          }
          uVar3 = uVar3 + 1;
          lVar6 = lVar6 + (long)stride * 4;
        } while (uVar3 != (uint)height);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)channels);
  }
  return;
}

Assistant:

void av1_cnn_activate_c(float **output, int channels, int width, int height,
                        int stride, ACTIVATION layer_activation) {
  if (layer_activation == RELU) {
    for (int c = 0; c < channels; ++c) {
      for (int i = 0; i < height; ++i)
        for (int j = 0; j < width; ++j)
          output[c][i * stride + j] = relu(output[c][i * stride + j]);
    }
  } else if (layer_activation == SOFTSIGN) {
    for (int c = 0; c < channels; ++c) {
      for (int i = 0; i < height; ++i)
        for (int j = 0; j < width; ++j)
          output[c][i * stride + j] = softsign(output[c][i * stride + j]);
    }
  } else if (layer_activation == SIGMOID) {
    assert(0 && "Sigmoid has not been supported in CNN.");  // TO DO
  } else if (layer_activation != NONE) {
    assert(0 && "Unknown activation type");
  }
}